

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

int lyd_node_pos_cmp(void *item1,void *item2)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  lys_module *plVar4;
  lys_module *plVar5;
  
  plVar4 = lys_node_module((lys_node *)**item1);
  plVar5 = lys_node_module((lys_node *)**item2);
  if (plVar4 == plVar5) {
    uVar3 = 1;
    if (*(uint *)((long)item1 + 8) <= *(uint *)((long)item2 + 8)) {
      uVar3 = -(uint)(*(uint *)((long)item1 + 8) < *(uint *)((long)item2 + 8));
    }
  }
  else {
    plVar4 = lys_node_module((lys_node *)**item1);
    uVar1 = lys_module_pos(plVar4);
    plVar4 = lys_node_module((lys_node *)**item2);
    uVar2 = lys_module_pos(plVar4);
    uVar3 = (uVar2 < uVar1) - 1 | 1;
  }
  return uVar3;
}

Assistant:

static int
lyd_node_pos_cmp(const void *item1, const void *item2)
{
    uint32_t mpos1, mpos2;
    struct lyd_node_pos *np1, *np2;

    np1 = (struct lyd_node_pos *)item1;
    np2 = (struct lyd_node_pos *)item2;

    /* different modules? */
    if (lys_node_module(np1->node->schema) != lys_node_module(np2->node->schema)) {
        mpos1 = lys_module_pos(lys_node_module(np1->node->schema));
        mpos2 = lys_module_pos(lys_node_module(np2->node->schema));
        /* if lys_module_pos failed, there is nothing we can do anyway,
         * at least internal error will be printed */

        if (mpos1 > mpos2) {
            return 1;
        } else {
            return -1;
        }
    }

    if (np1->pos > np2->pos) {
        return 1;
    } else if (np1->pos < np2->pos) {
        return -1;
    }
    return 0;
}